

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variables.hh
# Opt level: O2

uint __thiscall
tchecker::
array_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::declare(array_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *this,string *name,intvar_info_t *info)

{
  uint id;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  id = size_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::declare(&this->
                  super_size_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ,name,info);
  local_40._8_8_ = 0;
  local_28 = std::
             _Function_handler<void_(unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_tchecker::intvar_info_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/variables/variables.hh:566:52)>
             ::_M_invoke;
  local_30 = std::
             _Function_handler<void_(unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_tchecker::intvar_info_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/variables/variables.hh:566:52)>
             ::_M_manager;
  local_40._M_unused._M_object = this;
  declare_flattened_variable<unsigned_int,tchecker::intvar_info_t>
            (id,name,info,
             (function<void_(unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_tchecker::intvar_info_t_&)>
              *)&local_40);
  std::_Function_base::~_Function_base((_Function_base *)&local_40);
  return id;
}

Assistant:

ID declare(std::string const & name, INFO const & info)
  {
    ID id = tchecker::size_variables_t<ID, INFO, INDEX>::declare(name, info);
    tchecker::declare_flattened_variable<ID, INFO>(id, name, info,
                                                   [&](ID flat_id, std::string const & flat_name, INFO const & flat_info) {
                                                     _flattened_variables.declare(flat_id, flat_name, flat_info);
                                                   });
    return id;
  }